

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::verifyOutputImage
          (FunctionalTest *this,testCase *test_case,size_t output_format_index,
          GLint output_channel_size,size_t index_of_swizzled_channel,GLubyte *data)

{
  short sVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  GLint GVar7;
  GLint GVar8;
  GLint GVar9;
  GLint GVar10;
  GLint GVar11;
  GLint GVar12;
  GLint GVar13;
  GLint GVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  GLubyte GVar18;
  undefined2 uVar19;
  GLubyte GVar20;
  undefined2 uVar21;
  uint uVar22;
  undefined8 *puVar23;
  TestError *this_00;
  long lVar24;
  bool bVar25;
  bool bVar26;
  GLubyte expected_data_top [8];
  GLubyte expected_data_low [8];
  size_t texel_size;
  
  expected_data_low[0] = '\0';
  expected_data_low[1] = '\0';
  expected_data_low[2] = '\0';
  expected_data_low[3] = '\0';
  expected_data_low[4] = '\0';
  expected_data_low[5] = '\0';
  expected_data_low[6] = '\0';
  expected_data_low[7] = '\0';
  expected_data_top[0] = '\0';
  expected_data_top[1] = '\0';
  expected_data_top[2] = '\0';
  expected_data_top[3] = '\0';
  expected_data_top[4] = '\0';
  expected_data_top[5] = '\0';
  expected_data_top[6] = '\0';
  expected_data_top[7] = '\0';
  texel_size = 0;
  calculate_expected_value
            (test_case->m_source_texture_format_index,output_format_index,index_of_swizzled_channel,
             test_case->m_texture_sizes[index_of_swizzled_channel],output_channel_size,
             expected_data_low,expected_data_top,&texel_size);
  uVar22 = *(int *)(&DAT_021cdf8c + output_format_index * 0x78) - 0x1400;
  if ((0xb < uVar22) || ((0x87fU >> (uVar22 & 0x1f) & 1) == 0)) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x107f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar18 = expected_data_top[0];
  GVar20 = expected_data_low[0];
  uVar19 = expected_data_top._0_2_;
  uVar21 = expected_data_low._0_2_;
  lVar24 = 0x40;
  do {
    switch(uVar22) {
    case 0:
    case 0xb:
      bVar26 = (char)*data <= (char)GVar18;
      bVar25 = (char)GVar20 <= (char)*data;
      break;
    case 1:
      bVar26 = *data <= GVar18;
      bVar25 = GVar20 <= *data;
      break;
    case 2:
      sVar1 = *(short *)data;
      if ((short)uVar19 < sVar1) goto LAB_0085c67b;
      bVar26 = SBORROW2(sVar1,uVar21);
      bVar25 = (short)(sVar1 - uVar21) < 0;
      goto LAB_0085c659;
    case 3:
    case 5:
      if ((ushort)uVar19 < *(ushort *)data) goto LAB_0085c67b;
      bVar25 = (ushort)uVar21 <= *(ushort *)data;
      goto LAB_0085c65d;
    case 4:
      fVar2 = *(float *)data;
      if ((int)expected_data_top._0_4_ < (int)fVar2) goto LAB_0085c67b;
      bVar26 = SBORROW4((int)fVar2,expected_data_low._0_4_);
      bVar25 = (int)fVar2 - expected_data_low._0_4_ < 0;
LAB_0085c659:
      bVar25 = bVar26 == bVar25;
      goto LAB_0085c65d;
    default:
      if (((float)expected_data_top._0_4_ < *(float *)data) ||
         (*(float *)data < (float)expected_data_low._0_4_)) goto LAB_0085c67b;
      goto LAB_0085c662;
    }
    bVar25 = (bool)(bVar25 & bVar26);
LAB_0085c65d:
    if (!bVar25) {
LAB_0085c67b:
      puVar23 = (undefined8 *)__cxa_allocate_exception(0x48);
      *puVar23 = &PTR__exception_02106ad0;
      uVar3 = *(undefined4 *)((long)&test_case->m_channel_index + 4);
      sVar15 = test_case->m_source_texture_format_index;
      uVar4 = *(undefined4 *)((long)&test_case->m_source_texture_format_index + 4);
      sVar16 = test_case->m_source_texture_target_index;
      uVar5 = *(undefined4 *)((long)&test_case->m_source_texture_target_index + 4);
      sVar17 = test_case->m_texture_access_index;
      uVar6 = *(undefined4 *)((long)&test_case->m_texture_access_index + 4);
      GVar7 = test_case->m_texture_swizzle_red;
      GVar8 = test_case->m_texture_swizzle_green;
      GVar9 = test_case->m_texture_swizzle_blue;
      GVar10 = test_case->m_texture_swizzle_alpha;
      GVar11 = test_case->m_texture_sizes[0];
      GVar12 = test_case->m_texture_sizes[1];
      GVar13 = test_case->m_texture_sizes[2];
      GVar14 = test_case->m_texture_sizes[3];
      *(int *)(puVar23 + 1) = (int)test_case->m_channel_index;
      *(undefined4 *)((long)puVar23 + 0xc) = uVar3;
      *(int *)(puVar23 + 2) = (int)sVar15;
      *(undefined4 *)((long)puVar23 + 0x14) = uVar4;
      *(int *)(puVar23 + 3) = (int)sVar16;
      *(undefined4 *)((long)puVar23 + 0x1c) = uVar5;
      *(int *)(puVar23 + 4) = (int)sVar17;
      *(undefined4 *)((long)puVar23 + 0x24) = uVar6;
      *(GLint *)(puVar23 + 5) = GVar7;
      *(GLint *)((long)puVar23 + 0x2c) = GVar8;
      *(GLint *)(puVar23 + 6) = GVar9;
      *(GLint *)((long)puVar23 + 0x34) = GVar10;
      *(GLint *)(puVar23 + 7) = GVar11;
      *(GLint *)((long)puVar23 + 0x3c) = GVar12;
      *(GLint *)(puVar23 + 8) = GVar13;
      *(GLint *)((long)puVar23 + 0x44) = GVar14;
      __cxa_throw(puVar23,&wrongResults::typeinfo,std::exception::~exception);
    }
LAB_0085c662:
    data = (GLubyte *)((long)data + texel_size);
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void FunctionalTest::verifyOutputImage(const testCase& test_case, size_t output_format_index,
									   glw::GLint output_channel_size, size_t index_of_swizzled_channel,
									   const glw::GLubyte* data)
{
	const _texture_format& output_format = texture_formats[output_format_index];

	glw::GLubyte expected_data_low[8] = { 0 };
	glw::GLubyte expected_data_top[8] = { 0 };
	size_t		 texel_size			  = 0;

	calculate_expected_value(test_case.m_source_texture_format_index, output_format_index, index_of_swizzled_channel,
							 test_case.m_texture_sizes[index_of_swizzled_channel], output_channel_size,
							 expected_data_low, expected_data_top, texel_size);

	for (size_t i = 0; i < m_output_height * m_output_width; ++i)
	{
		const size_t	   offset  = i * texel_size;
		const glw::GLvoid* pointer = data + offset;

		bool res = false;

		switch (output_format.m_type)
		{
		case GL_BYTE:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_BYTE:
			res = isInRange<glw::GLubyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_SHORT:
			res = isInRange<glw::GLshort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_SHORT:
			res = isInRange<glw::GLushort>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_HALF_FLOAT:
			res = isInRange<glw::GLbyte>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_INT:
			res = isInRange<glw::GLint>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_UNSIGNED_INT:
			res = isInRange<glw::GLhalf>(pointer, expected_data_low, expected_data_top);
			break;
		case GL_FLOAT:
			res = isInRange<glw::GLfloat>(pointer, expected_data_low, expected_data_top);
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		if (false == res)
		{
			throw wrongResults(test_case);
		}
	}
}